

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O2

void __thiscall
cbtGImpactMeshShape::buildMeshParts
          (cbtGImpactMeshShape *this,cbtStridingMeshInterface *meshInterface)

{
  int iVar1;
  cbtGImpactMeshShapePart *this_00;
  int part;
  cbtGImpactMeshShapePart *newpart;
  cbtGImpactMeshShapePart *local_30;
  
  part = 0;
  while( true ) {
    iVar1 = (*meshInterface->_vptr_cbtStridingMeshInterface[7])(meshInterface);
    if (iVar1 <= part) break;
    this_00 = (cbtGImpactMeshShapePart *)cbtConcaveShape::operator_new(0x118);
    cbtGImpactMeshShapePart::cbtGImpactMeshShapePart(this_00,meshInterface,part);
    local_30 = this_00;
    cbtAlignedObjectArray<cbtGImpactMeshShapePart_*>::push_back(&this->m_mesh_parts,&local_30);
    part = part + 1;
  }
  return;
}

Assistant:

void buildMeshParts(cbtStridingMeshInterface* meshInterface)
	{
		for (int i = 0; i < meshInterface->getNumSubParts(); ++i)
		{
			cbtGImpactMeshShapePart* newpart = new cbtGImpactMeshShapePart(meshInterface, i);
			m_mesh_parts.push_back(newpart);
		}
	}